

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O3

IFrameVisualization * __thiscall iDynTree::Visualizer::frames(Visualizer *this)

{
  return &(this->pimpl->m_invalidFrames).super_IFrameVisualization;
}

Assistant:

IFrameVisualization &Visualizer::frames()
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( !this->pimpl->m_isInitialized )
    {
        init();
    }
    return this->pimpl->m_frames;
#else
    return this->pimpl->m_invalidFrames;
#endif
}